

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::RandomOrderTexImageCubeCase::createTexture
          (RandomOrderTexImageCubeCase *this)

{
  ContextWrapper *this_00;
  TextureFormatInfo *minVal;
  Vec4 *maxVal;
  CubeFace CVar1;
  deUint32 internalFormat;
  deUint32 format;
  deUint32 type;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  deUint32 tex;
  int local_fc;
  vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_> images;
  Random rnd;
  TextureLevel levelData;
  Vec4 gMax;
  Vec4 gMin;
  PixelBufferAccess local_58;
  
  tex = 0;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  dVar2 = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2);
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
  vector(&images,(long)((this->super_TextureCubeSpecCase).m_numLevels * 6),
         (allocator_type *)&local_58);
  iVar4 = (this->super_TextureCubeSpecCase).m_numLevels;
  iVar3 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (iVar5 = 0; iVar5 != iVar4; iVar5 = iVar5 + 1) {
    for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
      iVar7 = iVar3 + (CubeFace)lVar6;
      images.
      super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].first = iVar5;
      images.
      super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].second = (CubeFace)lVar6;
    }
    iVar3 = iVar3 + 6;
  }
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<std::pair<int,tcu::CubeFace>*,std::vector<std::pair<int,tcu::CubeFace>,std::allocator<std::pair<int,tcu::CubeFace>>>>>
            (&rnd,(__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
                   )images.
                    super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
              )images.
               super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  minVal = &(this->super_TextureCubeSpecCase).m_texFormatInfo;
  maxVal = &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax;
  lVar6 = 0;
  while( true ) {
    if ((int)((ulong)((long)images.
                            super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)images.
                           super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar6) break;
    local_fc = images.
               super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar6].first;
    iVar4 = (this->super_TextureCubeSpecCase).m_size >> ((byte)local_fc & 0x1f);
    CVar1 = images.
            super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar6].second;
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    randomVector<4>((Functional *)&gMin,&rnd,&minVal->valueMin,maxVal);
    randomVector<4>((Functional *)&gMax,&rnd,&minVal->valueMin,maxVal);
    tcu::TextureLevel::setSize(&levelData,iVar4,iVar4,1);
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    dVar2 = (&s_cubeMapFaces)[CVar1];
    internalFormat = this->m_internalFormat;
    format = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    sglr::ContextWrapper::glTexImage2D
              (this_00,dVar2,local_fc,internalFormat,iVar4,iVar4,0,format,type,
               local_58.super_ConstPixelBufferAccess.m_data);
    lVar6 = lVar6 + 1;
  }
  std::_Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
  ::~_Vector_base(&images.
                   super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                 );
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Level-face pairs.
		vector<pair<int, tcu::CubeFace> >	images	(m_numLevels*6);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				images[ndx*6 + face] = std::make_pair(ndx, (tcu::CubeFace)face);

		rnd.shuffle(images.begin(), images.end());

		for (int ndx = 0; ndx < (int)images.size(); ndx++)
		{
			int				levelNdx	= images[ndx].first;
			tcu::CubeFace	face		= images[ndx].second;
			int				levelSize	= de::max(1, m_size >> levelNdx);
			Vec4			gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4			gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelSize, levelSize);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(s_cubeMapFaces[face], levelNdx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}